

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_uri.c
# Opt level: O3

ares_status_t ares_uri_set_host(ares_uri_t *uri,char *host)

{
  ares_bool_t aVar1;
  size_t sVar2;
  char *pcVar3;
  void *pvVar4;
  ares_status_t aVar5;
  size_t addrlen;
  char ipaddr [46];
  char hoststr [256];
  ares_addr local_178;
  size_t local_160;
  char local_158 [48];
  char local_128 [264];
  
  if (uri == (ares_uri_t *)0x0) {
    return ARES_EFORMERR;
  }
  sVar2 = ares_strlen(host);
  if (sVar2 == 0) {
    return ARES_EFORMERR;
  }
  sVar2 = ares_strlen(host);
  if (0xff < sVar2) {
    return ARES_EFORMERR;
  }
  ares_strcpy(local_128,host,0x100);
  pcVar3 = strchr(local_128,0x25);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)0x0;
LAB_0012788f:
    local_178._0_8_ = 0;
    local_178.addr._4_8_ = 0;
    local_178.addr._12_4_ = 0;
    pvVar4 = ares_dns_pton(local_128,&local_178,&local_160);
    if (pvVar4 == (void *)0x0) {
      aVar1 = ares_is_hostname(host);
      if (aVar1 == ARES_FALSE) goto LAB_00127922;
    }
    else {
      ares_inet_ntop(local_178.family,&local_178.addr,local_158,0x2e);
      if ((pcVar3 != (char *)0x0) && (local_178.family != 10)) {
        return ARES_EBADNAME;
      }
      if (pcVar3 != (char *)0x0) {
        snprintf(uri->host,0x100,"%s%%%s",local_158,pcVar3);
        return ARES_SUCCESS;
      }
      host = local_158;
    }
    ares_strcpy(uri->host,host,0x100);
    aVar5 = ARES_SUCCESS;
  }
  else {
    *pcVar3 = '\0';
    pcVar3 = pcVar3 + 1;
    aVar1 = ares_str_isalnum(pcVar3);
    if (aVar1 != ARES_FALSE) goto LAB_0012788f;
LAB_00127922:
    aVar5 = ARES_EBADNAME;
  }
  return aVar5;
}

Assistant:

ares_status_t ares_uri_set_host(ares_uri_t *uri, const char *host)
{
  struct ares_addr addr;
  size_t           addrlen;
  char             hoststr[256];
  char            *ll_scope;

  if (uri == NULL || ares_strlen(host) == 0 ||
      ares_strlen(host) >= sizeof(hoststr)) {
    return ARES_EFORMERR;
  }

  ares_strcpy(hoststr, host, sizeof(hoststr));

  /* Look for '%' which could be a link-local scope for ipv6 addresses and
   * parse it off */
  ll_scope = strchr(hoststr, '%');
  if (ll_scope != NULL) {
    *ll_scope = 0;
    ll_scope++;
    if (!ares_str_isalnum(ll_scope)) {
      return ARES_EBADNAME;
    }
  }

  /* If its an IP address, normalize it */
  memset(&addr, 0, sizeof(addr));
  addr.family = AF_UNSPEC;
  if (ares_dns_pton(hoststr, &addr, &addrlen) != NULL) {
    char ipaddr[INET6_ADDRSTRLEN];
    ares_inet_ntop(addr.family, &addr.addr, ipaddr, sizeof(ipaddr));
    /* Only IPv6 is allowed to have a scope */
    if (ll_scope != NULL && addr.family != AF_INET6) {
      return ARES_EBADNAME;
    }

    if (ll_scope != NULL) {
      snprintf(uri->host, sizeof(uri->host), "%s%%%s", ipaddr, ll_scope);
    } else {
      ares_strcpy(uri->host, ipaddr, sizeof(uri->host));
    }
    return ARES_SUCCESS;
  }

  /* If its a hostname, make sure its a valid charset */
  if (!ares_is_hostname(host)) {
    return ARES_EBADNAME;
  }

  ares_strcpy(uri->host, host, sizeof(uri->host));
  return ARES_SUCCESS;
}